

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86func.cpp
# Opt level: O2

Error asmjit::v1_14::x86::FuncInternal::initCallConv
                (CallConv *cc,CallConvId ccId,Environment *environment)

{
  Array<unsigned_char,_4UL> *this;
  Array<unsigned_char,_4UL> *this_00;
  CallConvFlags CVar1;
  Error EVar2;
  uchar *puVar3;
  uint uVar4;
  bool bVar5;
  bool bVar6;
  RegGroup local_3a [10];
  
  uVar4 = (uint)ccId;
  bVar5 = environment->_platform != kWindows;
  bVar6 = environment->_platformABI != kMSVC;
  cc->_arch = environment->_arch;
  local_3a[4] = 1;
  this = &cc->_saveRestoreRegSize;
  puVar3 = Support::Array<unsigned_char,_4UL>::operator[]<asmjit::v1_14::RegGroup>
                     (this,local_3a + 4);
  *puVar3 = '\x10';
  local_3a[3] = 3;
  puVar3 = Support::Array<unsigned_char,_4UL>::operator[]<asmjit::v1_14::RegGroup>
                     (this,local_3a + 3);
  *puVar3 = '\b';
  local_3a[2] = 2;
  puVar3 = Support::Array<unsigned_char,_4UL>::operator[]<asmjit::v1_14::RegGroup>
                     (this,local_3a + 2);
  *puVar3 = '\b';
  local_3a[9] = 1;
  this_00 = &cc->_saveRestoreAlignment;
  puVar3 = Support::Array<unsigned_char,_4UL>::operator[]<asmjit::v1_14::RegGroup>
                     (this_00,local_3a + 9);
  *puVar3 = '\x10';
  local_3a[8] = 3;
  puVar3 = Support::Array<unsigned_char,_4UL>::operator[]<asmjit::v1_14::RegGroup>
                     (this_00,local_3a + 8);
  *puVar3 = '\b';
  local_3a[7] = 2;
  puVar3 = Support::Array<unsigned_char,_4UL>::operator[]<asmjit::v1_14::RegGroup>
                     (this_00,local_3a + 7);
  *puVar3 = '\b';
  if ((environment->_arch & k32BitMask) == kUnknown) {
    local_3a[0] = k0;
    puVar3 = Support::Array<unsigned_char,_4UL>::operator[]<asmjit::v1_14::RegGroup>(this,local_3a);
    *puVar3 = '\b';
    local_3a[5] = 0;
    puVar3 = Support::Array<unsigned_char,_4UL>::operator[]<asmjit::v1_14::RegGroup>
                       (this_00,local_3a + 5);
    *puVar3 = '\b';
    if ((uVar4 - 4 < 4) || (uVar4 < 3)) {
      if (bVar6 && bVar5) {
LAB_0013fa1c:
        cc->_flags = kVarArgCompatible|kPassMmxByXmm|kPassFloatsByVec;
        cc->_naturalStackAlignment = '\x10';
        cc->_redZoneSize = 0x80;
        CallConv::setPassedOrder(cc,k0,7,6,2,1,8,9,0xff,0xff);
        CallConv::setPassedOrder(cc,kVec,0,1,2,3,4,5,6,7);
        CallConv::setPreservedRegs(cc,k0,0xf038);
        ccId = kX64SystemV;
      }
      else {
LAB_0013f997:
        cc->_strategy = kX64Windows;
        cc->_flags = kVarArgCompatible|kPassMmxByGp|kPassFloatsByVec|kIndirectVecArgs;
        cc->_spillZoneSize = ' ';
        cc->_naturalStackAlignment = '\x10';
        CallConv::setPassedOrder(cc,k0,1,2,8,9,0xff,0xff,0xff,0xff);
        CallConv::setPassedOrder(cc,kVec,0,1,2,3,0xff,0xff,0xff,0xff);
        CallConv::setPreservedRegs(cc,k0,0xf0f8);
        CallConv::setPreservedRegs(cc,kVec,0xffc0);
        ccId = kMaxValue;
      }
    }
    else if (uVar4 - 0x10 < 3) {
      cc->_flags = kPassFloatsByVec;
      cc->_naturalStackAlignment = '\x10';
      CallConv::setPassedOrder(cc,k0,0,2,1,6,7,0xff,0xff,0xff);
      CallConv::setPassedOrder(cc,kVec,0,1,2,3,4,5,6,7);
      CallConv::setPassedOrder(cc,kMask,0,1,2,3,4,5,6,7);
      CallConv::setPassedOrder(cc,kExtraVirt3,0,1,2,3,4,5,6,7);
      CallConv::setPreservedRegs(cc,k0,0xffff);
      CallConv::setPreservedRegs(cc,kVec,(RegMask)(-1L << (ccId - 0xe & 0x3f)));
    }
    else {
      if (uVar4 != 3) {
        if (uVar4 == 0x20) goto LAB_0013fa1c;
        if (uVar4 != 0x21) {
          return 2;
        }
        goto LAB_0013f997;
      }
      cc->_strategy = kMaxValue;
      cc->_flags = kPassMmxByGp|kPassFloatsByVec;
      cc->_spillZoneSize = '0';
      cc->_naturalStackAlignment = '\x10';
      CallConv::setPassedOrder(cc,k0,1,2,8,9,0xff,0xff,0xff,0xff);
      CallConv::setPassedOrder(cc,kVec,0,1,2,3,4,5,0xff,0xff);
      CallConv::setPreservedRegs(cc,k0,0xf0f8);
      CallConv::setPreservedRegs(cc,kVec,0xffc0);
      ccId = kVectorCall;
    }
  }
  else {
    local_3a[1] = 0;
    puVar3 = Support::Array<unsigned_char,_4UL>::operator[]<asmjit::v1_14::RegGroup>
                       (this,local_3a + 1);
    *puVar3 = '\x04';
    local_3a[6] = 0;
    puVar3 = Support::Array<unsigned_char,_4UL>::operator[]<asmjit::v1_14::RegGroup>
                       (this_00,local_3a + 6);
    *puVar3 = '\x04';
    CallConv::setPreservedRegs(cc,k0,0xf8);
    cc->_naturalStackAlignment = '\x04';
    EVar2 = 2;
    switch(ccId) {
    case kCDecl:
switchD_0013f897_caseD_0:
      bVar5 = true;
      break;
    case kStdCall:
      cc->_flags = kCalleePopsStack;
      ccId = kStdCall;
      bVar5 = false;
      break;
    case kFastCall:
      cc->_flags = kCalleePopsStack;
      bVar5 = false;
      CallConv::setPassedOrder(cc,k0,1,2,0xff,0xff,0xff,0xff,0xff,0xff);
      ccId = kFastCall;
      break;
    case kVectorCall:
      cc->_flags = kCalleePopsStack;
      bVar5 = false;
      CallConv::setPassedOrder(cc,k0,1,2,0xff,0xff,0xff,0xff,0xff,0xff);
      CallConv::setPassedOrder(cc,kVec,0,1,2,3,4,5,0xff,0xff);
      ccId = kVectorCall;
      break;
    case kThisCall:
      if (bVar6 && bVar5) {
        ccId = kCDecl;
        goto switchD_0013f897_caseD_0;
      }
      cc->_flags = kCalleePopsStack;
      bVar5 = false;
      CallConv::setPassedOrder(cc,k0,1,0xff,0xff,0xff,0xff,0xff,0xff,0xff);
      ccId = kThisCall;
      break;
    case kRegParm1:
      bVar5 = false;
      CallConv::setPassedOrder(cc,k0,0,0xff,0xff,0xff,0xff,0xff,0xff,0xff);
      ccId = kRegParm1;
      break;
    case kRegParm2:
      bVar5 = false;
      CallConv::setPassedOrder(cc,k0,0,2,0xff,0xff,0xff,0xff,0xff,0xff);
      ccId = kRegParm2;
      break;
    case kRegParm3:
      bVar5 = false;
      CallConv::setPassedOrder(cc,k0,0,2,1,0xff,0xff,0xff,0xff,0xff);
      ccId = kRegParm3;
      break;
    default:
      goto switchD_0013f897_caseD_8;
    case kLightCall2:
    case kLightCall3:
    case kLightCall4:
      cc->_flags = kPassFloatsByVec;
      CallConv::setPassedOrder(cc,k0,0,2,1,6,7,0xff,0xff,0xff);
      CallConv::setPassedOrder(cc,kVec,0,1,2,3,4,5,6,7);
      CallConv::setPassedOrder(cc,kMask,0,1,2,3,4,5,6,7);
      CallConv::setPassedOrder(cc,kExtraVirt3,0,1,2,3,4,5,6,7);
      CallConv::setPreservedRegs(cc,k0,0xff);
      CallConv::setPreservedRegs(cc,kVec,(uint)(-1L << (ccId - 0xe & 0x3f)) & 0xff);
      cc->_naturalStackAlignment = '\x10';
      goto LAB_0013fe10;
    }
    CallConv::setPassedOrder(cc,kExtraVirt3,0,1,2,0xff,0xff,0xff,0xff,0xff);
    CallConv::setPassedOrder(cc,kVec,0,1,2,0xff,0xff,0xff,0xff,0xff);
    CVar1 = cc->_flags;
    cc->_flags = CVar1 | kPassVecByStackIfVA;
    if (bVar5) {
      cc->_flags = CVar1 | (kVarArgCompatible|kPassVecByStackIfVA);
      ccId = kCDecl;
    }
  }
LAB_0013fe10:
  cc->_id = ccId;
  EVar2 = 0;
switchD_0013f897_caseD_8:
  return EVar2;
}

Assistant:

ASMJIT_FAVOR_SIZE Error initCallConv(CallConv& cc, CallConvId ccId, const Environment& environment) noexcept {
  constexpr uint32_t kZax = Gp::kIdAx;
  constexpr uint32_t kZbx = Gp::kIdBx;
  constexpr uint32_t kZcx = Gp::kIdCx;
  constexpr uint32_t kZdx = Gp::kIdDx;
  constexpr uint32_t kZsp = Gp::kIdSp;
  constexpr uint32_t kZbp = Gp::kIdBp;
  constexpr uint32_t kZsi = Gp::kIdSi;
  constexpr uint32_t kZdi = Gp::kIdDi;

  bool winABI = environment.isPlatformWindows() || environment.isMSVC();

  cc.setArch(environment.arch());
  cc.setSaveRestoreRegSize(RegGroup::kVec, 16);
  cc.setSaveRestoreRegSize(RegGroup::kX86_MM, 8);
  cc.setSaveRestoreRegSize(RegGroup::kX86_K, 8);
  cc.setSaveRestoreAlignment(RegGroup::kVec, 16);
  cc.setSaveRestoreAlignment(RegGroup::kX86_MM, 8);
  cc.setSaveRestoreAlignment(RegGroup::kX86_K, 8);

  if (environment.is32Bit()) {
    bool isStandardCallConv = true;

    cc.setSaveRestoreRegSize(RegGroup::kGp, 4);
    cc.setSaveRestoreAlignment(RegGroup::kGp, 4);

    cc.setPreservedRegs(RegGroup::kGp, Support::bitMask(Gp::kIdBx, Gp::kIdSp, Gp::kIdBp, Gp::kIdSi, Gp::kIdDi));
    cc.setNaturalStackAlignment(4);

    switch (ccId) {
      case CallConvId::kCDecl:
        break;

      case CallConvId::kStdCall:
        cc.setFlags(CallConvFlags::kCalleePopsStack);
        break;

      case CallConvId::kFastCall:
        cc.setFlags(CallConvFlags::kCalleePopsStack);
        cc.setPassedOrder(RegGroup::kGp, kZcx, kZdx);
        break;

      case CallConvId::kVectorCall:
        cc.setFlags(CallConvFlags::kCalleePopsStack);
        cc.setPassedOrder(RegGroup::kGp, kZcx, kZdx);
        cc.setPassedOrder(RegGroup::kVec, 0, 1, 2, 3, 4, 5);
        break;

      case CallConvId::kThisCall:
        // NOTE: Even MINGW (starting with GCC 4.7.0) now uses __thiscall on MS Windows, so we won't bail to any
        // other calling convention if __thiscall was specified.
        if (winABI) {
          cc.setFlags(CallConvFlags::kCalleePopsStack);
          cc.setPassedOrder(RegGroup::kGp, kZcx);
        }
        else {
          ccId = CallConvId::kCDecl;
        }
        break;

      case CallConvId::kRegParm1:
        cc.setPassedOrder(RegGroup::kGp, kZax);
        break;

      case CallConvId::kRegParm2:
        cc.setPassedOrder(RegGroup::kGp, kZax, kZdx);
        break;

      case CallConvId::kRegParm3:
        cc.setPassedOrder(RegGroup::kGp, kZax, kZdx, kZcx);
        break;

      case CallConvId::kLightCall2:
      case CallConvId::kLightCall3:
      case CallConvId::kLightCall4: {
        uint32_t n = uint32_t(ccId) - uint32_t(CallConvId::kLightCall2) + 2;

        cc.setFlags(CallConvFlags::kPassFloatsByVec);
        cc.setPassedOrder(RegGroup::kGp, kZax, kZdx, kZcx, kZsi, kZdi);
        cc.setPassedOrder(RegGroup::kVec, 0, 1, 2, 3, 4, 5, 6, 7);
        cc.setPassedOrder(RegGroup::kX86_K, 0, 1, 2, 3, 4, 5, 6, 7);
        cc.setPassedOrder(RegGroup::kX86_MM, 0, 1, 2, 3, 4, 5, 6, 7);
        cc.setPreservedRegs(RegGroup::kGp, Support::lsbMask<uint32_t>(8));
        cc.setPreservedRegs(RegGroup::kVec, Support::lsbMask<uint32_t>(8) & ~Support::lsbMask<uint32_t>(n));

        cc.setNaturalStackAlignment(16);
        isStandardCallConv = false;
        break;
      }

      default:
        return DebugUtils::errored(kErrorInvalidArgument);
    }

    if (isStandardCallConv) {
      // MMX arguments is something where compiler vendors disagree. For example GCC and MSVC would pass first three
      // via registers and the rest via stack, however Clang passes all via stack. Returning MMX registers is even
      // more fun, where GCC uses MM0, but Clang uses EAX:EDX pair. I'm not sure it's something we should be worried
      // about as MMX is deprecated anyway.
      cc.setPassedOrder(RegGroup::kX86_MM, 0, 1, 2);

      // Vector arguments (XMM|YMM|ZMM) are passed via registers. However, if the function is variadic then they have
      // to be passed via stack.
      cc.setPassedOrder(RegGroup::kVec, 0, 1, 2);

      // Functions with variable arguments always use stack for MM and vector arguments.
      cc.addFlags(CallConvFlags::kPassVecByStackIfVA);
    }

    if (ccId == CallConvId::kCDecl) {
      cc.addFlags(CallConvFlags::kVarArgCompatible);
    }
  }
  else {
    cc.setSaveRestoreRegSize(RegGroup::kGp, 8);
    cc.setSaveRestoreAlignment(RegGroup::kGp, 8);

    // Preprocess the calling convention into a common id as many conventions are normally ignored even by C/C++
    // compilers and treated as `__cdecl`.
    if (shouldTreatAsCDeclIn64BitMode(ccId))
      ccId = winABI ? CallConvId::kX64Windows : CallConvId::kX64SystemV;

    switch (ccId) {
      case CallConvId::kX64SystemV: {
        cc.setFlags(CallConvFlags::kPassFloatsByVec |
                    CallConvFlags::kPassMmxByXmm    |
                    CallConvFlags::kVarArgCompatible);
        cc.setNaturalStackAlignment(16);
        cc.setRedZoneSize(128);
        cc.setPassedOrder(RegGroup::kGp, kZdi, kZsi, kZdx, kZcx, 8, 9);
        cc.setPassedOrder(RegGroup::kVec, 0, 1, 2, 3, 4, 5, 6, 7);
        cc.setPreservedRegs(RegGroup::kGp, Support::bitMask(kZbx, kZsp, kZbp, 12, 13, 14, 15));
        break;
      }

      case CallConvId::kX64Windows: {
        cc.setStrategy(CallConvStrategy::kX64Windows);
        cc.setFlags(CallConvFlags::kPassFloatsByVec |
                    CallConvFlags::kIndirectVecArgs |
                    CallConvFlags::kPassMmxByGp     |
                    CallConvFlags::kVarArgCompatible);
        cc.setNaturalStackAlignment(16);
        // Maximum 4 arguments in registers, each adds 8 bytes to the spill zone.
        cc.setSpillZoneSize(4 * 8);
        cc.setPassedOrder(RegGroup::kGp, kZcx, kZdx, 8, 9);
        cc.setPassedOrder(RegGroup::kVec, 0, 1, 2, 3);
        cc.setPreservedRegs(RegGroup::kGp, Support::bitMask(kZbx, kZsp, kZbp, kZsi, kZdi, 12, 13, 14, 15));
        cc.setPreservedRegs(RegGroup::kVec, Support::bitMask(6, 7, 8, 9, 10, 11, 12, 13, 14, 15));
        break;
      }

      case CallConvId::kVectorCall: {
        cc.setStrategy(CallConvStrategy::kX64VectorCall);
        cc.setFlags(CallConvFlags::kPassFloatsByVec |
                    CallConvFlags::kPassMmxByGp     );
        cc.setNaturalStackAlignment(16);
        // Maximum 6 arguments in registers, each adds 8 bytes to the spill zone.
        cc.setSpillZoneSize(6 * 8);
        cc.setPassedOrder(RegGroup::kGp, kZcx, kZdx, 8, 9);
        cc.setPassedOrder(RegGroup::kVec, 0, 1, 2, 3, 4, 5);
        cc.setPreservedRegs(RegGroup::kGp, Support::bitMask(kZbx, kZsp, kZbp, kZsi, kZdi, 12, 13, 14, 15));
        cc.setPreservedRegs(RegGroup::kVec, Support::bitMask(6, 7, 8, 9, 10, 11, 12, 13, 14, 15));
        break;
      }

      case CallConvId::kLightCall2:
      case CallConvId::kLightCall3:
      case CallConvId::kLightCall4: {
        uint32_t n = uint32_t(ccId) - uint32_t(CallConvId::kLightCall2) + 2;

        cc.setFlags(CallConvFlags::kPassFloatsByVec);
        cc.setNaturalStackAlignment(16);
        cc.setPassedOrder(RegGroup::kGp, kZax, kZdx, kZcx, kZsi, kZdi);
        cc.setPassedOrder(RegGroup::kVec, 0, 1, 2, 3, 4, 5, 6, 7);
        cc.setPassedOrder(RegGroup::kX86_K, 0, 1, 2, 3, 4, 5, 6, 7);
        cc.setPassedOrder(RegGroup::kX86_MM, 0, 1, 2, 3, 4, 5, 6, 7);

        cc.setPreservedRegs(RegGroup::kGp, Support::lsbMask<uint32_t>(16));
        cc.setPreservedRegs(RegGroup::kVec, ~Support::lsbMask<uint32_t>(n));
        break;
      }

      default:
        return DebugUtils::errored(kErrorInvalidArgument);
    }
  }

  cc.setId(ccId);
  return kErrorOk;
}